

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/application.cpp:63:33)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_application_cpp:63:33)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  Application *pAVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  uint __len;
  ulong __val;
  string __str;
  long *local_70;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pAVar1 = (this->f).this;
  iVar4 = ParseStream::getInt(this_00);
  uVar8 = (ulong)iVar4;
  __val = -uVar8;
  if (0 < (long)uVar8) {
    __val = uVar8;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0013ba7f;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0013ba7f;
      }
      if (uVar6 < 10000) goto LAB_0013ba7f;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_0013ba7f:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(iVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            (local_50[0] + -((long)uVar8 >> 0x3f),__len,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x258d78);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&pAVar1->rtcore,(ulong)local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }